

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Node ast;
  Parser parser;
  Node NStack_3c8;
  Parser local_388;
  
  Parser::Parser(&local_388);
  Parser::parse(&NStack_3c8,&local_388);
  lab2_3(&local_388);
  std::vector<Node,_std::allocator<Node>_>::~vector(&NStack_3c8.subnodes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)NStack_3c8.value._M_dataplus._M_p != &NStack_3c8.value.field_2) {
    operator_delete(NStack_3c8.value._M_dataplus._M_p,
                    NStack_3c8.value.field_2._M_allocated_capacity + 1);
  }
  Parser::~Parser(&local_388);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    Parser parser = Parser();
    Node ast = parser.parse();
    lab2_3(parser); // done
//    lab4(parser); // done
//    lab5(); // done
//    lab6(ast); // done
//    lab7(parser, ast); // done
    return 0;

}